

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::copy_render_pass2
          (Impl *this,VkRenderPassCreateInfo2 *create_info,ScratchAllocator *alloc,
          VkRenderPassCreateInfo2 **out_create_info)

{
  bool bVar1;
  VkRenderPassCreateInfo2 *pVVar2;
  VkAttachmentDescription2 *pVVar3;
  VkSubpassDescription2 *pVVar4;
  VkSubpassDependency2 *pVVar5;
  uint *puVar6;
  VkAttachmentReference2 *pVVar7;
  VkSubpassDescription2 *sub;
  uint32_t i;
  VkRenderPassCreateInfo2 *info;
  VkRenderPassCreateInfo2 **out_create_info_local;
  ScratchAllocator *alloc_local;
  VkRenderPassCreateInfo2 *create_info_local;
  Impl *this_local;
  
  pVVar2 = copy<VkRenderPassCreateInfo2>(this,create_info,1,alloc);
  pVVar3 = copy<VkAttachmentDescription2>
                     (this,pVVar2->pAttachments,(ulong)pVVar2->attachmentCount,alloc);
  pVVar2->pAttachments = pVVar3;
  pVVar4 = copy<VkSubpassDescription2>(this,pVVar2->pSubpasses,(ulong)pVVar2->subpassCount,alloc);
  pVVar2->pSubpasses = pVVar4;
  pVVar5 = copy<VkSubpassDependency2>
                     (this,pVVar2->pDependencies,(ulong)pVVar2->dependencyCount,alloc);
  pVVar2->pDependencies = pVVar5;
  puVar6 = copy<unsigned_int>(this,pVVar2->pCorrelatedViewMasks,
                              (ulong)pVVar2->correlatedViewMaskCount,alloc);
  pVVar2->pCorrelatedViewMasks = puVar6;
  if ((pVVar2->pAttachments != (VkAttachmentDescription2 *)0x0) &&
     (bVar1 = copy_pnext_chains<VkAttachmentDescription2>
                        (this,pVVar2->pAttachments,pVVar2->attachmentCount,alloc,
                         (DynamicStateInfo *)0x0,0), !bVar1)) {
    return false;
  }
  if ((pVVar2->pSubpasses != (VkSubpassDescription2 *)0x0) &&
     (bVar1 = copy_pnext_chains<VkSubpassDescription2>
                        (this,pVVar2->pSubpasses,pVVar2->subpassCount,alloc,(DynamicStateInfo *)0x0,
                         0), !bVar1)) {
    return false;
  }
  if ((pVVar2->pDependencies != (VkSubpassDependency2 *)0x0) &&
     (bVar1 = copy_pnext_chains<VkSubpassDependency2>
                        (this,pVVar2->pDependencies,pVVar2->dependencyCount,alloc,
                         (DynamicStateInfo *)0x0,0), !bVar1)) {
    return false;
  }
  sub._4_4_ = 0;
  while( true ) {
    if (pVVar2->subpassCount <= sub._4_4_) {
      bVar1 = copy_pnext_chain(this,create_info->pNext,alloc,&pVVar2->pNext,(DynamicStateInfo *)0x0,
                               0);
      if (bVar1) {
        *out_create_info = pVVar2;
      }
      return bVar1;
    }
    pVVar4 = pVVar2->pSubpasses;
    if (pVVar4[sub._4_4_].pDepthStencilAttachment != (VkAttachmentReference2 *)0x0) {
      pVVar7 = copy<VkAttachmentReference2>(this,pVVar4[sub._4_4_].pDepthStencilAttachment,1,alloc);
      pVVar4[sub._4_4_].pDepthStencilAttachment = pVVar7;
    }
    if (pVVar4[sub._4_4_].pColorAttachments != (VkAttachmentReference2 *)0x0) {
      pVVar7 = copy<VkAttachmentReference2>
                         (this,pVVar4[sub._4_4_].pColorAttachments,
                          (ulong)pVVar4[sub._4_4_].colorAttachmentCount,alloc);
      pVVar4[sub._4_4_].pColorAttachments = pVVar7;
    }
    if (pVVar4[sub._4_4_].pResolveAttachments != (VkAttachmentReference2 *)0x0) {
      pVVar7 = copy<VkAttachmentReference2>
                         (this,pVVar4[sub._4_4_].pResolveAttachments,
                          (ulong)pVVar4[sub._4_4_].colorAttachmentCount,alloc);
      pVVar4[sub._4_4_].pResolveAttachments = pVVar7;
    }
    if (pVVar4[sub._4_4_].pInputAttachments != (VkAttachmentReference2 *)0x0) {
      pVVar7 = copy<VkAttachmentReference2>
                         (this,pVVar4[sub._4_4_].pInputAttachments,
                          (ulong)pVVar4[sub._4_4_].inputAttachmentCount,alloc);
      pVVar4[sub._4_4_].pInputAttachments = pVVar7;
    }
    if (pVVar4[sub._4_4_].pPreserveAttachments != (uint32_t *)0x0) {
      puVar6 = copy<unsigned_int>(this,pVVar4[sub._4_4_].pPreserveAttachments,
                                  (ulong)pVVar4[sub._4_4_].preserveAttachmentCount,alloc);
      pVVar4[sub._4_4_].pPreserveAttachments = puVar6;
    }
    if ((pVVar4[sub._4_4_].pColorAttachments != (VkAttachmentReference2 *)0x0) &&
       (bVar1 = copy_pnext_chains<VkAttachmentReference2>
                          (this,pVVar4[sub._4_4_].pColorAttachments,
                           pVVar4[sub._4_4_].colorAttachmentCount,alloc,(DynamicStateInfo *)0x0,0),
       !bVar1)) {
      return false;
    }
    if ((pVVar4[sub._4_4_].pInputAttachments != (VkAttachmentReference2 *)0x0) &&
       (bVar1 = copy_pnext_chains<VkAttachmentReference2>
                          (this,pVVar4[sub._4_4_].pInputAttachments,
                           pVVar4[sub._4_4_].inputAttachmentCount,alloc,(DynamicStateInfo *)0x0,0),
       !bVar1)) {
      return false;
    }
    if ((pVVar4[sub._4_4_].pResolveAttachments != (VkAttachmentReference2 *)0x0) &&
       (bVar1 = copy_pnext_chains<VkAttachmentReference2>
                          (this,pVVar4[sub._4_4_].pResolveAttachments,
                           pVVar4[sub._4_4_].colorAttachmentCount,alloc,(DynamicStateInfo *)0x0,0),
       !bVar1)) break;
    if ((pVVar4[sub._4_4_].pDepthStencilAttachment != (VkAttachmentReference2 *)0x0) &&
       (bVar1 = copy_pnext_chains<VkAttachmentReference2>
                          (this,pVVar4[sub._4_4_].pDepthStencilAttachment,1,alloc,
                           (DynamicStateInfo *)0x0,0), !bVar1)) {
      return false;
    }
    sub._4_4_ = sub._4_4_ + 1;
  }
  return false;
}

Assistant:

bool StateRecorder::Impl::copy_render_pass2(const VkRenderPassCreateInfo2 *create_info, ScratchAllocator &alloc,
                                            VkRenderPassCreateInfo2 **out_create_info)
{
	auto *info = copy(create_info, 1, alloc);
	info->pAttachments = copy(info->pAttachments, info->attachmentCount, alloc);
	info->pSubpasses = copy(info->pSubpasses, info->subpassCount, alloc);
	info->pDependencies = copy(info->pDependencies, info->dependencyCount, alloc);
	info->pCorrelatedViewMasks = copy(info->pCorrelatedViewMasks, info->correlatedViewMaskCount, alloc);

	if (info->pAttachments && !copy_pnext_chains(info->pAttachments, info->attachmentCount, alloc, nullptr, 0))
		return false;
	if (info->pSubpasses && !copy_pnext_chains(info->pSubpasses, info->subpassCount, alloc, nullptr, 0))
		return false;
	if (info->pDependencies && !copy_pnext_chains(info->pDependencies, info->dependencyCount, alloc, nullptr, 0))
		return false;

	for (uint32_t i = 0; i < info->subpassCount; i++)
	{
		auto &sub = const_cast<VkSubpassDescription2 &>(info->pSubpasses[i]);
		if (sub.pDepthStencilAttachment)
			sub.pDepthStencilAttachment = copy(sub.pDepthStencilAttachment, 1, alloc);
		if (sub.pColorAttachments)
			sub.pColorAttachments = copy(sub.pColorAttachments, sub.colorAttachmentCount, alloc);
		if (sub.pResolveAttachments)
			sub.pResolveAttachments = copy(sub.pResolveAttachments, sub.colorAttachmentCount, alloc);
		if (sub.pInputAttachments)
			sub.pInputAttachments = copy(sub.pInputAttachments, sub.inputAttachmentCount, alloc);
		if (sub.pPreserveAttachments)
			sub.pPreserveAttachments = copy(sub.pPreserveAttachments, sub.preserveAttachmentCount, alloc);

		if (sub.pColorAttachments && !copy_pnext_chains(sub.pColorAttachments, sub.colorAttachmentCount, alloc, nullptr, 0))
			return false;
		if (sub.pInputAttachments && !copy_pnext_chains(sub.pInputAttachments, sub.inputAttachmentCount, alloc, nullptr, 0))
			return false;
		if (sub.pResolveAttachments && !copy_pnext_chains(sub.pResolveAttachments, sub.colorAttachmentCount, alloc, nullptr, 0))
			return false;
		if (sub.pDepthStencilAttachment && !copy_pnext_chains(sub.pDepthStencilAttachment, 1, alloc, nullptr, 0))
			return false;
	}

	if (!copy_pnext_chain(create_info->pNext, alloc, &info->pNext, nullptr, 0))
		return false;

	*out_create_info = info;
	return true;
}